

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O0

void __thiscall
mvm::
interpreter<(anonymous_namespace)::mini_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
::
produce_unroll<mvm::value_stack<mvm::list::mplist<unsigned_int>>,std::tuple<unsigned_int,unsigned_int>,0ul,1ul>
          (interpreter<(anonymous_namespace)::mini_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
           *this,tuple<unsigned_int,_unsigned_int> *arg)

{
  value_stack<mvm::list::mplist<unsigned_int>_> *pvVar1;
  __tuple_element_t<0UL,_tuple<unsigned_int,_unsigned_int>_> *val;
  __tuple_element_t<1UL,_tuple<unsigned_int,_unsigned_int>_> *val_00;
  tuple<unsigned_int,_unsigned_int> *arg_local;
  interpreter<(anonymous_namespace)::mini_set,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>_>_>
  *this_local;
  
  pvVar1 = std::
           get<mvm::value_stack<mvm::list::mplist<unsigned_int>>,mvm::bytecode_serializer,mvm::value_stack<mvm::list::mplist<unsigned_int>>>
                     ((tuple<mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>
                       *)(this + 8));
  val = std::get<0ul,unsigned_int,unsigned_int>(arg);
  value_stack<mvm::list::mplist<unsigned_int>_>::push<unsigned_int>(pvVar1,val);
  pvVar1 = std::
           get<mvm::value_stack<mvm::list::mplist<unsigned_int>>,mvm::bytecode_serializer,mvm::value_stack<mvm::list::mplist<unsigned_int>>>
                     ((tuple<mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>
                       *)(this + 8));
  val_00 = std::get<1ul,unsigned_int,unsigned_int>(arg);
  value_stack<mvm::list::mplist<unsigned_int>_>::push<unsigned_int>(pvVar1,val_00);
  return;
}

Assistant:

void interpreter<Set, InstancesList>::produce_unroll(
    T &&arg, std::index_sequence<Is...>) {

  (std::get<IS>(m_instances)
       .template push<typename std::tuple_element<Is, std::decay_t<T>>::type>(
           std::get<Is>(std::forward<T>(arg))),
   ...);
}